

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

VdbeCursor * allocateCursor(Vdbe *p,int iCur,int nField,u8 eCurType)

{
  VdbeCursor *__s;
  char *pcVar1;
  int local_54;
  Mem *local_48;
  VdbeCursor *pCx;
  int nByte;
  Mem *pMem;
  u8 eCurType_local;
  int nField_local;
  int iCur_local;
  Vdbe *p_local;
  
  if (iCur < 1) {
    local_48 = p->aMem;
  }
  else {
    local_48 = p->aMem + (p->nMem - iCur);
  }
  if (eCurType == '\0') {
    local_54 = sqlite3BtreeCursorSize();
  }
  else {
    local_54 = 0;
  }
  local_54 = nField * 8 + 0x78 + local_54;
  if (p->apCsr[iCur] != (VdbeCursor *)0x0) {
    sqlite3VdbeFreeCursorNN(p,p->apCsr[iCur]);
    p->apCsr[iCur] = (VdbeCursor *)0x0;
  }
  if (local_48->szMalloc < local_54) {
    if (0 < local_48->szMalloc) {
      sqlite3DbFreeNN(local_48->db,local_48->zMalloc);
    }
    pcVar1 = (char *)sqlite3DbMallocRaw(local_48->db,(long)local_54);
    local_48->zMalloc = pcVar1;
    local_48->z = pcVar1;
    if (local_48->zMalloc == (char *)0x0) {
      local_48->szMalloc = 0;
      return (VdbeCursor *)0x0;
    }
    local_48->szMalloc = local_54;
  }
  __s = (VdbeCursor *)local_48->zMalloc;
  p->apCsr[iCur] = __s;
  memset(__s,0,0x20);
  __s->eCurType = eCurType;
  __s->nField = (i16)nField;
  __s->aOffset = __s->aType + nField;
  if (eCurType == '\0') {
    (__s->uc).pCursor = (BtCursor *)(local_48->z + (long)nField * 8 + 0x78);
    sqlite3BtreeCursorZero((__s->uc).pCursor);
  }
  return __s;
}

Assistant:

static VdbeCursor *allocateCursor(
  Vdbe *p,              /* The virtual machine */
  int iCur,             /* Index of the new VdbeCursor */
  int nField,           /* Number of fields in the table or index */
  u8 eCurType           /* Type of the new cursor */
){
  /* Find the memory cell that will be used to store the blob of memory
  ** required for this VdbeCursor structure. It is convenient to use a
  ** vdbe memory cell to manage the memory allocation required for a
  ** VdbeCursor structure for the following reasons:
  **
  **   * Sometimes cursor numbers are used for a couple of different
  **     purposes in a vdbe program. The different uses might require
  **     different sized allocations. Memory cells provide growable
  **     allocations.
  **
  **   * When using ENABLE_MEMORY_MANAGEMENT, memory cell buffers can
  **     be freed lazily via the sqlite3_release_memory() API. This
  **     minimizes the number of malloc calls made by the system.
  **
  ** The memory cell for cursor 0 is aMem[0]. The rest are allocated from
  ** the top of the register space.  Cursor 1 is at Mem[p->nMem-1].
  ** Cursor 2 is at Mem[p->nMem-2]. And so forth.
  */
  Mem *pMem = iCur>0 ? &p->aMem[p->nMem-iCur] : p->aMem;

  int nByte;
  VdbeCursor *pCx = 0;
  nByte =
      ROUND8P(sizeof(VdbeCursor)) + 2*sizeof(u32)*nField +
      (eCurType==CURTYPE_BTREE?sqlite3BtreeCursorSize():0);

  assert( iCur>=0 && iCur<p->nCursor );
  if( p->apCsr[iCur] ){ /*OPTIMIZATION-IF-FALSE*/
    sqlite3VdbeFreeCursorNN(p, p->apCsr[iCur]);
    p->apCsr[iCur] = 0;
  }

  /* There used to be a call to sqlite3VdbeMemClearAndResize() to make sure
  ** the pMem used to hold space for the cursor has enough storage available
  ** in pMem->zMalloc.  But for the special case of the aMem[] entries used
  ** to hold cursors, it is faster to in-line the logic. */
  assert( pMem->flags==MEM_Undefined );
  assert( (pMem->flags & MEM_Dyn)==0 );
  assert( pMem->szMalloc==0 || pMem->z==pMem->zMalloc );
  if( pMem->szMalloc<nByte ){
    if( pMem->szMalloc>0 ){
      sqlite3DbFreeNN(pMem->db, pMem->zMalloc);
    }
    pMem->z = pMem->zMalloc = sqlite3DbMallocRaw(pMem->db, nByte);
    if( pMem->zMalloc==0 ){
      pMem->szMalloc = 0;
      return 0;
    }
    pMem->szMalloc = nByte;
  }

  p->apCsr[iCur] = pCx = (VdbeCursor*)pMem->zMalloc;
  memset(pCx, 0, offsetof(VdbeCursor,pAltCursor));
  pCx->eCurType = eCurType;
  pCx->nField = nField;
  pCx->aOffset = &pCx->aType[nField];
  if( eCurType==CURTYPE_BTREE ){
    pCx->uc.pCursor = (BtCursor*)
        &pMem->z[ROUND8P(sizeof(VdbeCursor))+2*sizeof(u32)*nField];
    sqlite3BtreeCursorZero(pCx->uc.pCursor);
  }
  return pCx;
}